

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O2

void __thiscall
duckdb::RleBpDecoder::GetBatch<unsigned_int>
          (RleBpDecoder *this,data_ptr_t values_target_ptr,uint32_t batch_size)

{
  uint uVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  undefined8 uStack_38;
  
  uVar3 = 0;
  uStack_38 = in_RAX;
LAB_00e2ca90:
  do {
    uVar1 = batch_size - uVar3;
    if (batch_size < uVar3 || uVar1 == 0) {
      return;
    }
    uVar2 = this->repeat_count_;
    if (uVar2 == 0) {
      uVar2 = this->literal_count_;
      if (uVar2 == 0) {
        NextCounts(this);
        goto LAB_00e2ca90;
      }
      if (uVar1 < uVar2) {
        uVar2 = uVar1;
      }
      ParquetDecodeUtils::BitUnpack<unsigned_int>
                (&this->buffer_,&this->bitpack_pos,(uint *)(values_target_ptr + (ulong)uVar3 * 4),
                 (ulong)uVar2,(bitpacking_width_t)this->bit_width_);
      this->literal_count_ = this->literal_count_ - uVar2;
    }
    else {
      if (uVar1 < uVar2) {
        uVar2 = uVar1;
      }
      uStack_38 = CONCAT44((int)this->current_value_,(undefined4)uStack_38);
      ::std::__fill_n_a<unsigned_int*,unsigned_int,unsigned_int>
                (values_target_ptr + (ulong)uVar3 * 4,uVar2,(long)&uStack_38 + 4);
      this->repeat_count_ = this->repeat_count_ - uVar2;
    }
    uVar3 = uVar3 + uVar2;
  } while( true );
}

Assistant:

void GetBatch(data_ptr_t values_target_ptr, const uint32_t batch_size) {
		auto values = reinterpret_cast<T *>(values_target_ptr);
		uint32_t values_read = 0;

		while (values_read < batch_size) {
			if (repeat_count_ > 0) {
				auto repeat_batch = MinValue<uint32_t>(batch_size - values_read, repeat_count_);
				std::fill_n(values + values_read, repeat_batch, static_cast<T>(current_value_));
				repeat_count_ -= repeat_batch;
				values_read += repeat_batch;
			} else if (literal_count_ > 0) {
				auto literal_batch = MinValue<uint32_t>(batch_size - values_read, literal_count_);
				ParquetDecodeUtils::BitUnpack<T>(buffer_, bitpack_pos, values + values_read, literal_batch, bit_width_);
				literal_count_ -= literal_batch;
				values_read += literal_batch;
			} else {
				NextCounts();
			}
		}
		D_ASSERT(values_read == batch_size);
	}